

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

DWORD __thiscall TSparseArray::GetItem1(TSparseArray *this,DWORD index)

{
  _BASEVALS *p_Var1;
  ulong uVar2;
  uint *puVar3;
  DWORD DVar4;
  uint uVar5;
  uint uVar6;
  char *__function;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  if ((index & 0x1ff) == 0) {
    if (index >> 9 < (this->IndexToItem1).ItemCount) {
      return (this->IndexToItem1).ItemArray[index >> 9];
    }
  }
  else {
    DVar4 = FindGroup_Items1(this,index);
    if ((this->BaseVals).ItemCount <= DVar4) {
      __function = "T &TGenericArray<_BASEVALS>::operator[](size_t) [T = _BASEVALS]";
      goto LAB_00117c9a;
    }
    p_Var1 = (this->BaseVals).ItemArray;
    uVar8 = index - p_Var1[DVar4].BaseValue200;
    uVar5 = DVar4 << 4;
    uVar2 = *(ulong *)&p_Var1[DVar4].field_0x4;
    uVar6 = (uint)(uVar2 >> 0x17) & 0x1ff;
    uVar7 = uVar8 - uVar6;
    if (uVar8 < uVar6) {
      uVar6 = (uint)(uVar2 >> 7) & 0xff;
      uVar7 = uVar8 - uVar6;
      if (uVar8 < uVar6) {
        uVar7 = (uint)uVar2 & 0x7f;
        if (uVar7 <= uVar8) {
          uVar5 = uVar5 | 2;
          uVar8 = uVar8 - uVar7;
        }
      }
      else {
        uVar6 = (uint)uVar2 >> 0xf & 0xff;
        bVar11 = uVar8 < uVar6;
        uVar8 = uVar8 - uVar6;
        if (bVar11) {
          uVar5 = uVar5 | 4;
          uVar8 = uVar7;
        }
        else {
          uVar5 = uVar5 | 6;
        }
      }
    }
    else {
      uVar6 = (uint)(uVar2 >> 0x20);
      uVar10 = uVar6 >> 9 & 0x1ff;
      uVar9 = uVar8 - uVar10;
      if (uVar8 < uVar10) {
        bVar11 = uVar8 < (uVar6 & 0x1ff);
        uVar8 = uVar8 - (uVar6 & 0x1ff);
        if (bVar11) {
          uVar5 = uVar5 | 8;
          uVar8 = uVar7;
        }
        else {
          uVar5 = uVar5 | 10;
        }
      }
      else {
        uVar7 = uVar6 >> 0x12 & 0x1ff;
        bVar11 = uVar8 < uVar7;
        uVar8 = uVar8 - uVar7;
        if (bVar11) {
          uVar5 = uVar5 | 0xc;
          uVar8 = uVar9;
        }
        else {
          uVar5 = uVar5 | 0xe;
        }
      }
    }
    uVar7 = (this->ItemBits).ItemCount;
    if (uVar5 < uVar7) {
      puVar3 = (this->ItemBits).ItemArray;
      uVar6 = puVar3[uVar5];
      uVar9 = (uVar6 & 0x55555555) + (uVar6 >> 1 & 0x55555555);
      uVar9 = (uVar9 & 0x33333333) + (uVar9 >> 2 & 0x33333333);
      uVar9 = ((uVar9 & 0x7070707) + (uVar9 >> 4 & 0x7070707)) * 0x1010101;
      uVar10 = uVar9 >> 0x18;
      if (uVar8 < uVar10) {
LAB_00117c13:
        uVar5 = uVar5 << 5;
        uVar10 = uVar9 >> 8 & 0xff;
        uVar7 = uVar8 - uVar10;
        if (uVar8 < uVar10) {
          if ((uVar9 & 0xff) <= uVar8) {
            uVar5 = uVar5 | 8;
            uVar6 = uVar6 >> 8;
            uVar8 = uVar8 - (uVar9 & 0xff);
          }
        }
        else {
          uVar9 = uVar9 >> 0x10 & 0xff;
          bVar11 = uVar8 < uVar9;
          uVar8 = uVar8 - uVar9;
          if (bVar11) {
            uVar6 = uVar6 >> 0x10;
            uVar5 = uVar5 | 0x10;
            uVar8 = uVar7;
          }
          else {
            uVar6 = uVar6 >> 0x18;
            uVar5 = uVar5 | 0x18;
          }
        }
        if (uVar8 << 8 < 0x800) {
          return uVar5 + table_1BA1818[uVar6 & 0xff | uVar8 << 8];
        }
        __assert_fail("(bitGroup + distFromBase) < sizeof(table_1BA1818)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                      ,0x498,"DWORD TSparseArray::GetItem1(DWORD)");
      }
      uVar5 = uVar5 + 1;
      if (uVar5 < uVar7) {
        uVar6 = puVar3[uVar5];
        uVar7 = (uVar6 & 0x55555555) + (uVar6 >> 1 & 0x55555555);
        uVar7 = (uVar7 & 0x33333333) + (uVar7 >> 2 & 0x33333333);
        uVar9 = ((uVar7 & 0x7070707) + (uVar7 >> 4 & 0x7070707)) * 0x1010101;
        uVar8 = uVar8 - uVar10;
        goto LAB_00117c13;
      }
    }
  }
  __function = "T &TGenericArray<unsigned int>::operator[](size_t) [T = unsigned int]";
LAB_00117c9a:
  __assert_fail("index < ItemCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                ,0x1d0,__function);
}

Assistant:

DWORD GetItem1(DWORD index)
    {
        SETBITS setBits;
        DWORD distFromBase;
        DWORD groupIndex;
        DWORD dwordIndex;
        DWORD itemIndex;
        DWORD bitGroup;

        // If the index is at begin of the group, we just return the start value
        if ((index & 0x1FF) == 0)
            return IndexToItem1[INDEX_TO_GROUP(index)];

        // Find the group where the index belongs to
        groupIndex = FindGroup_Items1(index);

        // Calculate the base200 dword index (HOTS: 1959FD4)
        distFromBase = index - BaseVals[groupIndex].BaseValue200;
        dwordIndex = groupIndex << 0x04;

        // Calculate the dword index including the sub-checkpoint
        if (distFromBase < BaseVals[groupIndex].AddValue100)
        {
            // HOTS: 1959FF1
            if (distFromBase < BaseVals[groupIndex].AddValue80)
            {
                // HOTS: 0195A000
                if (distFromBase >= BaseVals[groupIndex].AddValue40)
                {
                    // HOTS: 195A007
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue40;
                    dwordIndex += 2;
                }
            }
            else
            {
                // HOTS: 195A00E
                if (distFromBase < BaseVals[groupIndex].AddValueC0)
                {
                    // HOTS: 195A01A
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue80;
                    dwordIndex += 4;
                }
                else
                {
                    // HOTS: 195A01F
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValueC0;
                    dwordIndex += 6;
                }
            }
        }
        else
        {
            // HOTS: 195A026
            if (distFromBase < BaseVals[groupIndex].AddValue180)
            {
                // HOTS: 195A037
                if (distFromBase < BaseVals[groupIndex].AddValue140)
                {
                    // HOTS: 195A041
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue100;
                    dwordIndex += 8;
                }
                else
                {
                    // HOTS: 195A048
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue140;
                    dwordIndex += 10;
                }
            }
            else
            {
                // HOTS: 195A04D
                if (distFromBase < BaseVals[groupIndex].AddValue1C0)
                {
                    // HOTS: 195A05A
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue180;
                    dwordIndex += 12;
                }
                else
                {
                    // HOTS: 195A061
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue1C0;
                    dwordIndex += 14;
                }
            }
        }

        // HOTS: 195A066
        bitGroup = ItemBits[dwordIndex];
        setBits = GetNumberOfSetBits(bitGroup);

        // Get total number of set bits in the bit group
        if (distFromBase >= setBits.u.Lower32)
        {
            // HOTS: 195A0B2
            bitGroup = ItemBits[++dwordIndex];
            distFromBase = distFromBase - setBits.u.Lower32;
            setBits = GetNumberOfSetBits(bitGroup);
        }

        // Calculate the item index
        itemIndex = (dwordIndex << 0x05);

        // Get the number of set bits in the lower word (HOTS: 195A0F6)
        if (distFromBase < setBits.u.Lower16)
        {
            // HOTS: 195A111
            if (distFromBase >= setBits.u.Lower08)
            {
                // HOTS: 195A111
                itemIndex = itemIndex + 0x08;
                bitGroup = bitGroup >> 0x08;
                distFromBase = distFromBase - setBits.u.Lower08;
            }
        }
        else
        {
            // HOTS: 195A119
            if (distFromBase < setBits.u.Lower24)
            {
                // HOTS: 195A125
                bitGroup = bitGroup >> 0x10;
                itemIndex = itemIndex + 0x10;
                distFromBase = distFromBase - setBits.u.Lower16;
            }
            else
            {
                // HOTS: 195A12F
                bitGroup = bitGroup >> 0x18;
                itemIndex = itemIndex + 0x18;
                distFromBase = distFromBase - setBits.u.Lower24;
            }
        }

        bitGroup = bitGroup & 0xFF;
        distFromBase = distFromBase << 0x08;

        // BUGBUG: Potential buffer overflow
        // Happens in Heroes of the Storm when index == 0x5B
        assert((bitGroup + distFromBase) < sizeof(table_1BA1818));
        return table_1BA1818[bitGroup + distFromBase] + itemIndex;
    }